

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall Args::Arg::Arg(Arg *this,Char flag,bool isWithValue,bool isRequired)

{
  byte in_CL;
  byte in_DL;
  char in_SIL;
  ArgIface *in_RDI;
  allocator local_1d [17];
  allocator local_c;
  byte local_b;
  byte local_a;
  char local_9;
  
  local_a = in_DL & 1;
  local_b = in_CL & 1;
  local_9 = in_SIL;
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_001973c8;
  *(byte *)&in_RDI[1]._vptr_ArgIface = local_a & 1;
  *(byte *)((long)&in_RDI[1]._vptr_ArgIface + 1) = local_b & 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ArgIface + 2) = 0;
  std::__cxx11::string::string((string *)&in_RDI[1].m_cmdLine);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[3].m_cmdLine,1,local_9,&local_c);
  std::allocator<char>::~allocator((allocator<char> *)&local_c);
  std::__cxx11::string::string((string *)&in_RDI[5].m_cmdLine);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[7].m_cmdLine,"arg",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::__cxx11::string::string((string *)&in_RDI[9].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xb].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xd].m_cmdLine);
  return;
}

Assistant:

inline
Arg::Arg( Char flag,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_flag( 1, flag )
	,	m_valueSpecifier( SL( "arg" ) )
{
}